

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::internal::UntypedMapBase::InsertUniqueInList
          (UntypedMapBase *this,map_index_t b,NodeBase *node)

{
  NodeBase *pNVar1;
  undefined1 auVar2 [16];
  map_index_t b_00;
  TableEntryPtr *pTVar3;
  string *psVar4;
  ulong *puVar5;
  iterator *it;
  ulong unaff_RBX;
  ulong uVar6;
  UntypedMapBase *this_00;
  UntypedMapBase *this_01;
  
  uVar6 = (ulong)b;
  pTVar3 = this->table_;
  pNVar1 = (NodeBase *)pTVar3[b];
  if ((pNVar1 == (NodeBase *)0x0) || (uVar6 = ((ulong)this->seed_ ^ (ulong)node) % 0xd, uVar6 < 7))
  {
    if (((ulong)pNVar1 & 1) == 0) {
      node->next = pNVar1;
      if (((ulong)node & 1) == 0) {
        pTVar3[b] = (TableEntryPtr)node;
        return;
      }
    }
    else {
      InsertUniqueInList((UntypedMapBase *)&stack0xfffffffffffffff0);
    }
    InsertUniqueInList((UntypedMapBase *)&stack0xfffffffffffffff0);
  }
  else if (((ulong)pNVar1 & 1) == 0) {
    node->next = pNVar1->next;
    pNVar1->next = node;
    return;
  }
  this_00 = (UntypedMapBase *)&stack0xfffffffffffffff0;
  InsertUniqueInList(this_00);
  this_01 = (UntypedMapBase *)&stack0xffffffffffffffd0;
  pTVar3 = (TableEntryPtr *)this_00->table_[uVar6 & 0xffffffff];
  if (((ulong)pTVar3 & 1) == 0) {
    unaff_RBX = 0;
    do {
      unaff_RBX = unaff_RBX + 1;
      pTVar3 = (TableEntryPtr *)*pTVar3;
    } while (pTVar3 != (TableEntryPtr *)0x0);
    if (unaff_RBX < 9) {
      psVar4 = (string *)0x0;
      goto LAB_0015fd40;
    }
  }
  else {
    TableEntryIsTooLong((UntypedMapBase *)&stack0xffffffffffffffd0);
  }
  psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                     (unaff_RBX,8,"count <= kMaxLength");
LAB_0015fd40:
  if (psVar4 == (string *)0x0) {
    return;
  }
  TableEntryIsTooLong();
  b_00 = KeyMapBase<unsigned_int>::BucketNumber
                   ((KeyMapBase<unsigned_int> *)this_01,(ViewType)psVar4);
  puVar5 = (ulong *)this_01->table_[b_00];
  if (((ulong)puVar5 & 1) == 0 && puVar5 != (ulong *)0x0) {
    do {
      if ((ViewType)puVar5[1] == (ViewType)psVar4) {
        return;
      }
      puVar5 = (ulong *)*puVar5;
    } while (puVar5 != (ulong *)0x0);
  }
  else if (((ulong)puVar5 & 1) != 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (ulong)psVar4 & 0xffffffff;
    FindFromTree(this_01,b_00,(VariantKey)(auVar2 << 0x40),it);
  }
  return;
}

Assistant:

void InsertUniqueInList(map_index_t b, NodeBase* node) {
    if (!TableEntryIsEmpty(b) && ShouldInsertAfterHead(node)) {
      auto* first = TableEntryToNode(table_[b]);
      node->next = first->next;
      first->next = node;
    } else {
      node->next = TableEntryToNode(table_[b]);
      table_[b] = NodeToTableEntry(node);
    }
  }